

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

void __thiscall pegmatite::Input::~Input(Input *this)

{
  this->_vptr_Input = (_func_int **)&PTR___cxa_pure_virtual_00165b00;
  std::__cxx11::string::~string((string *)&this->user_name);
  return;
}

Assistant:

Input::~Input() {}